

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O1

bool __thiscall
OpenMD::RNEMD::SPFMethod::getSelectedMolecule(SPFMethod *this,shared_ptr<OpenMD::SPFData> *spfData)

{
  Molecule *this_00;
  RealType RVar1;
  
  this_00 = SimInfo::getMoleculeByGlobalIndex
                      ((this->super_RNEMD).info_,
                       ((spfData->super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->globalID);
  if (this_00 != (Molecule *)0x0) {
    if ((this->super_RNEMD).useChargedSPF_ == true) {
      RVar1 = Molecule::getFixedCharge(this_00);
      if (RVar1 < 0.0) {
        this->spfTarget_ = -this->spfTarget_;
      }
      RVar1 = Molecule::getFixedCharge(this_00);
      this->spfTarget_ = this->spfTarget_ / ABS(RVar1);
    }
    SPFForceManager::setSelectedMolecule(this->forceManager_,this_00);
  }
  return true;
}

Assistant:

bool SPFMethod::getSelectedMolecule(std::shared_ptr<SPFData> spfData) {
    Molecule* selectedMolecule;

    selectedMolecule = info_->getMoleculeByGlobalIndex(spfData->globalID);

    if (selectedMolecule) {
      if (useChargedSPF_) {
        if (selectedMolecule->getFixedCharge() < 0.0) { spfTarget_ *= -1; }

        // Scale the particle flux by the charge yielding a current density
        convertParticlesToElectrons(selectedMolecule);
      }

      forceManager_->setSelectedMolecule(selectedMolecule);
    }

    return true;
  }